

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O2

CommandOptions * write_isxd_file(CommandOptions *Options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  _Alloc_hider _Var1;
  bool bVar2;
  char cVar3;
  int iVar4;
  AESEncContext *this;
  HMACContext *this_00;
  uint uVar5;
  long in_RSI;
  undefined1 *puVar6;
  long *plVar7;
  ui32_t read_count;
  FortunaRNG RNG;
  undefined4 uStack_284;
  undefined1 local_278 [16];
  string namespace_name;
  MXFWriter Writer;
  SequenceParser Parser;
  byte_t IV_buf [16];
  byte_t local_218 [8];
  int local_210;
  _Alloc_hider local_200;
  Result_t result;
  AttributeList doc_attr_list;
  AttributeList doc_attr_list_1;
  FrameBuffer FrameBuffer;
  WriterInfo Info;
  
  AS_02::ISXD::MXFWriter::MXFWriter(&Writer);
  ASDCP::DCData::FrameBuffer::FrameBuffer(&FrameBuffer,*(ui32_t *)(in_RSI + 0x20));
  ASDCP::DCData::SequenceParser::SequenceParser(&Parser);
  ASDCP::DCData::SequenceParser::OpenRead((string *)&result);
  if (-1 < _result) {
    if (*(char *)(in_RSI + 5) != '\0') {
      fwrite("ISXD Data\n",10,1,_stderr);
      fprintf(_stderr,"Frame Buffer size: %u\n",(ulong)*(uint *)(in_RSI + 0x20));
      if (_result < 0) goto LAB_0010e3fc;
    }
    if (*(char *)(in_RSI + 0xc) == '\0') {
      ASDCP::WriterInfo::WriterInfo(&Info,&s_MyInfo.super_WriterInfo);
      if (*(char *)(in_RSI + 2) == '\x01') {
        Info.AssetUUID._0_8_ = *(undefined8 *)(in_RSI + 0x45);
        Info.AssetUUID._8_8_ = *(undefined8 *)(in_RSI + 0x4d);
      }
      else {
        Kumu::GenRandomUUID(Info.AssetUUID);
      }
      Info.LabelSetType = LS_MXF_SMPTE;
      if (*(char *)(in_RSI + 1) == '\x01') {
        Kumu::FortunaRNG::FortunaRNG(&RNG);
        Kumu::GenRandomUUID(Info.ContextID);
        Info.EncryptedEssence = true;
        if (*(char *)(in_RSI + 0x34) == '\x01') {
          Info.CryptographicKeyID._0_8_ = *(undefined8 *)(in_RSI + 0x35);
          Info.CryptographicKeyID._8_8_ = *(undefined8 *)(in_RSI + 0x3d);
        }
        else {
          create_random_uuid(Info.CryptographicKeyID);
        }
        this = (AESEncContext *)operator_new(8);
        ASDCP::AESEncContext::AESEncContext(this);
        ASDCP::AESEncContext::InitKey((uchar *)&doc_attr_list);
        Kumu::Result_t::operator=(&result,(Result_t *)&doc_attr_list);
        Kumu::Result_t::~Result_t((Result_t *)&doc_attr_list);
        if (-1 < _result) {
          Kumu::FortunaRNG::FillRandom((uchar *)&RNG,(uint)IV_buf);
          ASDCP::AESEncContext::SetIVec((uchar *)&doc_attr_list);
          Kumu::Result_t::operator=(&result,(Result_t *)&doc_attr_list);
          Kumu::Result_t::~Result_t((Result_t *)&doc_attr_list);
          if ((-1 < _result) && (*(char *)(in_RSI + 4) == '\x01')) {
            Info.UsesHMAC = true;
            this_00 = (HMACContext *)operator_new(8);
            ASDCP::HMACContext::HMACContext(this_00);
            ASDCP::HMACContext::InitKey((uchar *)&doc_attr_list,(LabelSet_t)this_00);
            Kumu::Result_t::operator=(&result,(Result_t *)&doc_attr_list);
            Kumu::Result_t::~Result_t((Result_t *)&doc_attr_list);
          }
        }
        Kumu::FortunaRNG::~FortunaRNG(&RNG);
      }
      if (-1 < _result) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (in_RSI + 0x218);
        bVar2 = std::operator==(__lhs,"auto");
        if (bVar2) {
          IV_buf._0_8_ = local_218;
          IV_buf[8] = '\0';
          IV_buf[9] = '\0';
          IV_buf[10] = '\0';
          IV_buf[0xb] = '\0';
          IV_buf[0xc] = '\0';
          IV_buf[0xd] = '\0';
          IV_buf[0xe] = '\0';
          IV_buf[0xf] = '\0';
          _RNG = local_278;
          local_218[0] = '\0';
          local_278[0] = 0;
          namespace_name._M_dataplus._M_p = (pointer)&namespace_name.field_2;
          namespace_name._M_string_length = 0;
          namespace_name.field_2._M_local_buf[0] = '\0';
          ASDCP::DCData::SequenceParser::ReadFrame((FrameBuffer *)&doc_attr_list);
          Kumu::Result_t::operator=(&result,(Result_t *)&doc_attr_list);
          Kumu::Result_t::~Result_t((Result_t *)&doc_attr_list);
          if (-1 < _result) {
            doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
            _M_node._M_size = 0;
            doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
            _M_node.super__List_node_base._M_next = (_List_node_base *)&doc_attr_list;
            doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
            _M_node.super__List_node_base._M_prev = (_List_node_base *)&doc_attr_list;
            cVar3 = Kumu::GetXMLDocType((uchar *)FrameBuffer._8_8_,FrameBuffer._24_4_,
                                        (string *)IV_buf,(string *)&RNG,(string *)&namespace_name,
                                        (list *)&doc_attr_list);
            puVar6 = (undefined1 *)&Kumu::RESULT_FAIL;
            if (cVar3 != '\0') {
              puVar6 = Kumu::RESULT_OK;
            }
            Kumu::Result_t::operator=(&result,(Result_t *)puVar6);
            std::__cxx11::_List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::_M_clear
                      (&doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>)
            ;
            if ((-1 < _result) && (namespace_name._M_string_length != 0)) {
              std::__cxx11::string::_M_assign((string *)__lhs);
              std::__cxx11::string::~string((string *)&namespace_name);
              std::__cxx11::string::~string((string *)&RNG);
              std::__cxx11::string::~string((string *)IV_buf);
              goto LAB_0010dea2;
            }
          }
          fwrite("Unable to parse an XML namespace name from the input document.\n",0x3f,1,_stderr);
          Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
          std::__cxx11::string::~string((string *)&namespace_name);
          std::__cxx11::string::~string((string *)&RNG);
          std::__cxx11::string::~string((string *)IV_buf);
          ASDCP::WriterInfo::~WriterInfo(&Info);
          goto LAB_0010e40e;
        }
LAB_0010dea2:
        IV_buf[0] = '\0';
        IV_buf[1] = '@';
        IV_buf[2] = '\0';
        IV_buf[3] = '\0';
        _RNG = (undefined1 *)CONCAT44(uStack_284,1);
        namespace_name._M_dataplus._M_p._0_4_ = 10;
        AS_02::ISXD::MXFWriter::OpenWrite
                  ((string *)&doc_attr_list,(WriterInfo *)&Writer,(string *)(in_RSI + 0x268),
                   (Rational *)&Info,(uint *)__lhs,(IndexStrategy_t *)(in_RSI + 0x18),(uint *)IV_buf
                  );
        Kumu::Result_t::operator=(&result,(Result_t *)&doc_attr_list);
        Kumu::Result_t::~Result_t((Result_t *)&doc_attr_list);
      }
      ASDCP::WriterInfo::~WriterInfo(&Info);
      if (_result < 0) goto LAB_0010e3fc;
    }
    ASDCP::DCData::SequenceParser::Reset();
    Kumu::Result_t::operator=(&result,(Result_t *)&Info);
    Kumu::Result_t::~Result_t((Result_t *)&Info);
    for (uVar5 = 0; (-1 < _result && (uVar5 < *(uint *)(in_RSI + 0x10))); uVar5 = uVar5 + 1) {
      ASDCP::DCData::SequenceParser::ReadFrame((FrameBuffer *)&Info);
      Kumu::Result_t::operator=(&result,(Result_t *)&Info);
      Kumu::Result_t::~Result_t((Result_t *)&Info);
      if (-1 < _result) {
        if (*(char *)(in_RSI + 5) == '\x01') {
          ASDCP::DCData::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
        }
        if (*(char *)(in_RSI + 3) == '\x01') {
          FrameBuffer._36_4_ = 0;
        }
        if ((-1 < _result) && (*(char *)(in_RSI + 0xc) == '\0')) {
          AS_02::ISXD::MXFWriter::WriteFrame
                    ((FrameBuffer *)&Info,(AESEncContext *)&Writer,(HMACContext *)&FrameBuffer);
          Kumu::Result_t::operator=(&result,(Result_t *)&Info);
          Kumu::Result_t::~Result_t((Result_t *)&Info);
        }
      }
    }
    if (_result == Kumu::RESULT_ENDOFFILE) {
      Kumu::Result_t::operator=(&result,(Result_t *)Kumu::RESULT_OK);
    }
    if ((-1 < _result) && (*(char *)(in_RSI + 0xc) == '\0')) {
      ASDCP::FrameBuffer::FrameBuffer((FrameBuffer *)IV_buf);
      plVar7 = (long *)(in_RSI + 0x238);
      local_200._M_p = (pointer)plVar7;
      while (plVar7 = (long *)*plVar7, plVar7 != (long *)local_200._M_p) {
        iVar4 = Kumu::FileSize((string *)(plVar7 + 2));
        ASDCP::FrameBuffer::Capacity((uint)&Info);
        Kumu::Result_t::operator=(&result,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
        if (-1 < _result) {
          Kumu::FileReader::FileReader((FileReader *)&doc_attr_list);
          _RNG = local_278;
          local_278[0] = 0;
          Kumu::FileReader::OpenRead((string *)&Info);
          Kumu::Result_t::operator=(&result,(Result_t *)&Info);
          Kumu::Result_t::~Result_t((Result_t *)&Info);
          if (-1 < _result) {
            Kumu::FileReader::Read
                      (Info.ProductUUID,(uint)(FileReader *)&doc_attr_list,(uint *)IV_buf._8_8_);
            Kumu::Result_t::operator=(&result,(Result_t *)&Info);
            Kumu::Result_t::~Result_t((Result_t *)&Info);
            if (-1 < _result) {
              if (iVar4 != 0) {
                Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_READFAIL);
                std::__cxx11::string::~string((string *)&RNG);
                Kumu::FileReader::~FileReader((FileReader *)&doc_attr_list);
                goto LAB_0010e3e5;
              }
              Info.ProductUUID._0_8_ = Info.AssetUUID;
              Info.ProductUUID[8] = '\0';
              Info.ProductUUID[9] = '\0';
              Info.ProductUUID[10] = '\0';
              Info.ProductUUID[0xb] = '\0';
              Info.ProductUUID[0xc] = '\0';
              Info.ProductUUID[0xd] = '\0';
              Info.ProductUUID[0xe] = '\0';
              Info.ProductUUID[0xf] = '\0';
              namespace_name._M_dataplus._M_p = (pointer)&namespace_name.field_2;
              namespace_name._M_string_length = 0;
              Info.AssetUUID._0_8_ = Info.AssetUUID._0_8_ & 0xffffffffffffff00;
              namespace_name.field_2._M_local_buf[0] = '\0';
              doc_attr_list_1.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
              _M_node.super__List_node_base._M_next = (_List_node_base *)&doc_attr_list_1;
              doc_attr_list_1.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
              _M_node._M_size = 0;
              local_210 = iVar4;
              doc_attr_list_1.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
              _M_node.super__List_node_base._M_prev =
                   doc_attr_list_1.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>.
                   _M_impl._M_node.super__List_node_base._M_next;
              cVar3 = Kumu::GetXMLDocType((uchar *)IV_buf._8_8_,0,(string *)&Info,
                                          (string *)&namespace_name,(string *)&RNG,
                                          (list *)doc_attr_list_1.
                                                  super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next);
              puVar6 = Kumu::RESULT_OK;
              if (cVar3 == '\0') {
                puVar6 = (undefined1 *)&Kumu::RESULT_FAIL;
              }
              Kumu::Result_t::operator=(&result,(Result_t *)puVar6);
              std::__cxx11::_List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::_M_clear
                        (&doc_attr_list_1.
                          super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>);
              std::__cxx11::string::~string((string *)&namespace_name);
              std::__cxx11::string::~string((string *)&Info);
              if (-1 < _result) {
                AS_02::ISXD::MXFWriter::AddDmsGenericPartUtf8Text
                          ((FrameBuffer *)&Info,(AESEncContext *)&Writer,(HMACContext *)IV_buf);
                Kumu::Result_t::operator=(&result,(Result_t *)&Info);
                Kumu::Result_t::~Result_t((Result_t *)&Info);
                if (-1 < _result) {
                  namespace_name._M_dataplus._M_p = (pointer)0x0;
                  get_current_dms_text_descriptor
                            (&Writer,(GenericStreamTextBasedSet **)&namespace_name);
                  _Var1 = namespace_name._M_dataplus;
                  if (namespace_name._M_dataplus._M_p == (pointer)0x0) {
                    __assert_fail("text_object",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-wrap.cpp"
                                  ,0x7c1,"Result_t write_isxd_file(CommandOptions &)");
                  }
                  ASDCP::MXF::UTF16String::operator=
                            ((UTF16String *)(namespace_name._M_dataplus._M_p + 0xe8),"text/xml");
                  ASDCP::MXF::UTF16String::UTF16String((UTF16String *)&Info,(string *)&RNG);
                  ASDCP::MXF::optional_property<ASDCP::MXF::UTF16String>::operator=
                            ((optional_property<ASDCP::MXF::UTF16String> *)(_Var1._M_p + 0x138),
                             (UTF16String *)&Info);
                  std::__cxx11::string::~string((string *)(Info.ProductUUID + 8));
                  ASDCP::MXF::UTF16String::operator=
                            ((UTF16String *)(_Var1._M_p + 0x110),(string *)(in_RSI + 0x168));
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)&RNG);
          Kumu::FileReader::~FileReader((FileReader *)&doc_attr_list);
        }
      }
      if (-1 < _result) {
        AS_02::ISXD::MXFWriter::Finalize();
        Kumu::Result_t::operator=(&result,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
      }
LAB_0010e3e5:
      ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)IV_buf);
      if (plVar7 != (long *)local_200._M_p) goto LAB_0010e40e;
    }
  }
LAB_0010e3fc:
  Kumu::Result_t::Result_t((Result_t *)Options,&result);
LAB_0010e40e:
  Kumu::Result_t::~Result_t(&result);
  ASDCP::DCData::SequenceParser::~SequenceParser(&Parser);
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer.super_FrameBuffer);
  AS_02::ISXD::MXFWriter::~MXFWriter(&Writer);
  return Options;
}

Assistant:

Result_t
write_isxd_file(CommandOptions& Options)
{
  AESEncContext*          Context = 0;
  HMACContext*            HMAC = 0;
  AS_02::ISXD::MXFWriter Writer;
  DCData::FrameBuffer     FrameBuffer(Options.fb_size);
  DCData::SequenceParser  Parser;

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {

      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "ISXD Data\n");
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
  {
    WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
    if ( Options.asset_id_flag )
      memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
    else
      Kumu::GenRandomUUID(Info.AssetUUID);

    Info.LabelSetType = LS_MXF_SMPTE;

#ifdef HAVE_OPENSSL
      // configure encryption
    if( Options.key_flag )
	{
      byte_t                  IV_buf[CBC_BLOCK_SIZE];
      Kumu::FortunaRNG        RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
      {
        Info.UsesHMAC = true;
        HMAC = new HMACContext;
        result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
      }
	}
#endif // HAVE_OPENSSL

    if ( ASDCP_SUCCESS(result) )
      {
	if ( Options.isxd_document_namespace == "auto" )
	  {
	    // get ns of first item
	    std::string ns_prefix, type_name, namespace_name;
	    result = Parser.ReadFrame(FrameBuffer);

	    if ( ASDCP_SUCCESS(result) )
	      {
		Kumu::AttributeList doc_attr_list;
		result = GetXMLDocType(FrameBuffer.RoData(), FrameBuffer.Size(), ns_prefix, type_name,
				       namespace_name, doc_attr_list) ? RESULT_OK : RESULT_FAIL;
	      }

	    if ( ASDCP_SUCCESS(result) && ! namespace_name.empty() )
	      {
		Options.isxd_document_namespace = namespace_name;
	      }
	    else
	      {
		fprintf(stderr, "Unable to parse an XML namespace name from the input document.\n");
		return RESULT_FAIL;
	      }
	  }

	result = Writer.OpenWrite(Options.out_file, Info, Options.isxd_document_namespace, Options.edit_rate);
      }
  }

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t duration = 0;
      result = Parser.Reset();

      while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
	  result = Parser.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);

	      if ( Options.encrypt_header_flag )
		FrameBuffer.PlaintextOffset(0);
	    }

	  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
	    {
	      result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

	      // The Writer class will forward the last block of ciphertext
	      // to the encryption context for use as the IV for the next
	      // frame. If you want to use non-sequitur IV values, un-comment
	      // the following  line of code.
	      // if ( ASDCP_SUCCESS(result) && Options.key_flag )
	      //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
	    }
	}

      if ( result == RESULT_ENDOFFILE )
	{
	  result = RESULT_OK;
	}
    }
  
  if ( KM_SUCCESS(result) && ! Options.no_write_flag )
    {
      ASDCP::FrameBuffer global_metadata;
      std::list<std::string>::iterator i;
      
      for ( i = Options.global_isxd_metadata.begin(); i != Options.global_isxd_metadata.end(); ++i )
	{
	  ui32_t file_size = Kumu::FileSize(*i);
	  result = global_metadata.Capacity(file_size);

	  if ( KM_SUCCESS(result) )
	    {
	      ui32_t read_count = 0;
	      Kumu::FileReader Reader;
	      std::string namespace_name;

	      result = Reader.OpenRead(*i);

	      if ( KM_SUCCESS(result) )
		{
		  result = Reader.Read(global_metadata.Data(), file_size, &read_count);
		}

	      if ( KM_SUCCESS(result) )
		{
		  if ( file_size != read_count) 
		    return RESULT_READFAIL;

		  global_metadata.Size(read_count);
		  std::string ns_prefix, type_name;
		  Kumu::AttributeList doc_attr_list;
		  result = GetXMLDocType(global_metadata.RoData(), global_metadata.Size(), ns_prefix, type_name,
					 namespace_name, doc_attr_list) ? RESULT_OK : RESULT_FAIL;
		}

	      if ( KM_SUCCESS(result) )
		{
		  result = Writer.AddDmsGenericPartUtf8Text(global_metadata, Context, HMAC);
		}

	      if ( KM_SUCCESS(result) )
		{
		  ASDCP::MXF::GenericStreamTextBasedSet *text_object = 0;
		  get_current_dms_text_descriptor(Writer, text_object);
		  assert(text_object);
		  text_object->TextMIMEMediaType = "text/xml";
		  text_object->TextDataDescription = namespace_name;

		  // this is not really useful when inserting multiple objects because
		  // it cannot be set per object without some other CLI syntax for
		  // associating language codes with 2057 blobs, e.g., <filename>:<lang>
		  text_object->RFC5646TextLanguageCode = Options.language;
		}
	    }
	}

      if ( KM_SUCCESS(result) )
	{
	  result = Writer.Finalize();
	}
    }

  return result;
}